

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32
drwav_init_file_write__internal_FILE
          (drwav *pWav,FILE *pFile,drwav_data_format *pFormat,drwav_uint64 totalSampleCount,
          drwav_bool32 isSequential,drwav_allocation_callbacks *pAllocationCallbacks)

{
  drwav_bool32 dVar1;
  
  dVar1 = drwav_preinit_write(pWav,pFormat,isSequential,drwav__on_write_stdio,drwav__on_seek_stdio,
                              pFile,pAllocationCallbacks);
  if ((dVar1 != 0) &&
     (dVar1 = drwav_init_write__internal(pWav,pFormat,totalSampleCount), dVar1 != 0)) {
    return 1;
  }
  fclose((FILE *)pFile);
  return 0;
}

Assistant:

static drwav_bool32 drwav_init_file_write__internal_FILE(drwav* pWav, FILE* pFile, const drwav_data_format* pFormat, drwav_uint64 totalSampleCount, drwav_bool32 isSequential, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    drwav_bool32 result;

    result = drwav_preinit_write(pWav, pFormat, isSequential, drwav__on_write_stdio, drwav__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (result != DRWAV_TRUE) {
        fclose(pFile);
        return result;
    }

    result = drwav_init_write__internal(pWav, pFormat, totalSampleCount);
    if (result != DRWAV_TRUE) {
        fclose(pFile);
        return result;
    }

    return DRWAV_TRUE;
}